

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

void uv_os_free_group(uv_group_t *grp)

{
  int iVar1;
  char **ppcVar2;
  int *piVar3;
  
  if (grp != (uv_group_t *)0x0) {
    ppcVar2 = grp->members;
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    (*(code *)uv__allocator_3)(ppcVar2);
    *piVar3 = iVar1;
    grp->members = (char **)0x0;
    grp->groupname = (char *)0x0;
  }
  return;
}

Assistant:

void uv_os_free_group(uv_group_t *grp) {
  if (grp == NULL)
    return;

  /* The memory for is allocated in a single uv__malloc() call. The base of the
   * pointer is stored in grp->members, so that is the only field that needs to
   * be freed.
   */
  uv__free(grp->members);
  grp->members = NULL;
  grp->groupname = NULL;
}